

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightsamplers.cpp
# Opt level: O2

string * __thiscall
pbrt::CompactLightBounds::ToString_abi_cxx11_
          (string *__return_storage_ptr__,CompactLightBounds *this,Bounds3f *allBounds)

{
  anon_struct_4_3_aa976015_for_CompactLightBounds_2 aVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar4 [64];
  undefined1 in_register_00001304 [12];
  Vector3f VVar6;
  uint *args_14;
  float local_6c;
  uint local_68;
  float local_64;
  uint local_60;
  float local_5c;
  undefined8 local_58;
  float local_50;
  Bounds3f local_48;
  undefined1 auVar5 [56];
  
  auVar5 = in_ZMM0._8_56_;
  Bounds(&local_48,this,allBounds);
  args_14 = (uint *)0x3b3e36;
  VVar6 = OctahedralVector::operator_cast_to_Vector3(&this->w);
  local_50 = VVar6.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar4._0_8_ = VVar6.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar4._8_56_ = auVar5;
  local_58 = vmovlps_avx(auVar4._0_16_);
  aVar1 = this->field_2;
  local_64 = (float)((uint)aVar1 >> 0xf & 0x7fff);
  local_6c = (float)((uint)aVar1 >> 0x1e & 1);
  local_5c = (float)((uint)aVar1 & 0x7fff);
  auVar2._0_4_ = (float)(int)local_5c / 32767.0;
  auVar2._4_12_ = in_register_00001304;
  auVar2 = vfmadd213ss_fma(auVar2,SUB6416(ZEXT464(0x40000000),0),SUB6416(ZEXT464(0xbf800000),0));
  local_60 = auVar2._0_4_;
  auVar3._0_4_ = (float)(int)local_64 / 32767.0;
  auVar3._4_12_ = in_register_00001304;
  auVar2 = vfmadd213ss_fma(auVar3,SUB6416(ZEXT464(0x40000000),0),SUB6416(ZEXT464(0xbf800000),0));
  local_68 = auVar2._0_4_;
  StringPrintf<pbrt::Bounds3<float>,unsigned_short_const&,unsigned_short_const&,unsigned_short_const&,unsigned_short_const&,unsigned_short_const&,unsigned_short_const&,pbrt::OctahedralVector_const&,pbrt::Vector3<float>,float_const&,unsigned_int_const&,float,unsigned_int_const&,float,unsigned_int_const&>
            (__return_storage_ptr__,
             (pbrt *)
             "[ CompactLightBounds b: %s qb: [ [ %u %u %u ] [ %u %u %u ] ] w: %s (%s) phi: %f qCosTheta_o: %u (%f) qCosTheta_e: %u (%f) twoSided: %u ]"
             ,(char *)&local_48,(Bounds3<float> *)this->qb,this->qb[0] + 1,this->qb[0] + 2,
             this->qb[1],this->qb[1] + 1,this->qb[1] + 2,(unsigned_short *)this,
             (OctahedralVector *)&local_58,(Vector3<float> *)&this->phi,&local_5c,&local_60,
             &local_64,&local_68,&local_6c,args_14);
  return __return_storage_ptr__;
}

Assistant:

std::string CompactLightBounds::ToString(const Bounds3f &allBounds) const {
    return StringPrintf(
        "[ CompactLightBounds b: %s qb: [ [ %u %u %u ] [ %u %u %u ] ] w: %s (%s) phi: %f "
        "qCosTheta_o: %u (%f) qCosTheta_e: %u (%f) twoSided: %u ]",
        Bounds(allBounds), qb[0][0], qb[0][1], qb[0][2], qb[1][0], qb[1][1], qb[1][2], w,
        Vector3f(w), phi, qCosTheta_o, CosTheta_o(), qCosTheta_e, CosTheta_e(), twoSided);
}